

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_UsecaseMultisig2_Test::TestBody(Psbt_UsecaseMultisig2_Test *this)

{
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Pubkey> __l_00;
  initializer_list<cfd::core::KeyData> __l_01;
  initializer_list<cfd::core::ByteData> __l_02;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  size_type sVar5;
  undefined1 extraout_DL;
  AssertionResult gtest_ar_28;
  CfdException *except_9;
  AssertionResult gtest_ar_27;
  Transaction tx_1;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_26;
  CfdException *except_8;
  AssertionResult gtest_ar_25;
  Script exp_script;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> wsh_script;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> wit_script;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Script script;
  ByteData sig2;
  ByteData sig1;
  AssertionResult gtest_ar_21;
  CfdException *except_7;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  CfdException *except_6;
  ByteData sig;
  ByteData256 sighash;
  Transaction tx;
  TxOut utxo_txout;
  SigHashType sighash_type;
  AssertionResult gtest_ar_17;
  CfdException *except_5;
  AssertionResult gtest_ar_16;
  CfdException *except_4;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  CfdException *except_3;
  Psbt psbt2;
  AssertionResult gtest_ar_12;
  CfdException *except_2;
  Psbt psbt1;
  AssertionResult gtest_ar_11;
  CfdException *except_1;
  Amount amount;
  AssertionResult gtest_ar_10;
  CfdException *except;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  TxIn txin;
  Transaction utxo_tx;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Script multisig;
  KeyData key_in2;
  KeyData key_in1;
  string in_path;
  Address addr;
  Script out_multisig;
  KeyData key2;
  KeyData key1;
  string path1;
  HDWallet wallet2;
  HDWallet wallet1;
  Psbt psbt;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffdf6c;
  KeyData *in_stack_ffffffffffffdf70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdf78;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_ffffffffffffdf80;
  char *in_stack_ffffffffffffdf88;
  undefined5 in_stack_ffffffffffffdf98;
  undefined1 in_stack_ffffffffffffdf9d;
  undefined1 in_stack_ffffffffffffdf9e;
  undefined1 in_stack_ffffffffffffdf9f;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_ffffffffffffdfa0;
  iterator in_stack_ffffffffffffdfa8;
  KeyData *in_stack_ffffffffffffdfb0;
  ByteData *local_1fc8;
  undefined1 ***local_1e70;
  undefined1 ***local_1d40;
  undefined1 ***local_1d18;
  AssertHelper local_1cd8;
  Message local_1cd0;
  string local_1cc8 [32];
  AssertionResult local_1ca8 [5];
  string local_1c58;
  AssertHelper local_1c38;
  Message local_1c30;
  byte local_1c21;
  AssertionResult local_1c20 [3];
  AssertHelper local_1be8;
  Message local_1be0;
  string local_1bd8 [80];
  string local_1b88 [32];
  AssertionResult local_1b68;
  Script local_1b58;
  AssertHelper local_1b20;
  Message local_1b18;
  size_type local_1b10;
  undefined4 local_1b04;
  AssertionResult local_1b00;
  AssertHelper local_1af0;
  Message local_1ae8;
  string local_1ae0 [32];
  string local_1ac0 [32];
  AssertionResult local_1aa0;
  AssertHelper local_1a90;
  Message local_1a88;
  size_type local_1a80;
  undefined4 local_1a74;
  AssertionResult local_1a70;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1a60;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1a48;
  string local_1a30;
  AssertHelper local_1a10;
  Message local_1a08;
  byte local_19f9;
  AssertionResult local_19f8;
  ByteData *local_19e0;
  ByteData local_19d8;
  undefined1 local_19c0 [24];
  undefined1 local_19a8 [24];
  undefined1 local_1990 [24];
  ByteData local_1978;
  string local_1950;
  AssertHelper local_1930;
  Message local_1928;
  byte local_1919;
  AssertionResult local_1918;
  string local_1908;
  AssertHelper local_18e8;
  Message local_18e0;
  byte local_18d1;
  AssertionResult local_18d0;
  undefined1 local_18c0 [80];
  undefined1 local_1870 [48];
  undefined1 local_1840 [64];
  AssertHelper local_1800;
  Message local_17f8;
  string local_17f0 [32];
  AssertionResult local_17d0;
  AssertHelper local_17c0;
  Message local_17b8 [4];
  string local_1798 [32];
  AssertionResult local_1778 [3];
  ByteData local_1740;
  undefined1 local_1728 [32];
  ByteData256 local_1708;
  undefined8 local_16f0;
  undefined1 local_16e8;
  undefined8 local_16e0;
  undefined1 local_16d8;
  SigHashType local_16cc [12];
  undefined1 local_16c0 [56];
  undefined1 local_1688 [24];
  undefined1 local_1670 [24];
  undefined1 local_1658 [64];
  undefined1 local_1618 [84];
  SigHashType local_15c4 [52];
  undefined1 local_1590 [72];
  AssertHelper local_1548;
  Message local_1540;
  string local_1538 [32];
  AssertionResult local_1518;
  AssertHelper local_1508;
  Message local_1500 [4];
  string local_14e0 [32];
  AssertionResult local_14c0 [3];
  Script local_1488;
  Psbt local_1438;
  Script local_1390;
  Psbt local_1340;
  undefined8 **local_1290;
  undefined1 **local_1288 [42];
  undefined1 local_1138 [336];
  undefined8 **local_fe8;
  undefined8 local_fe0;
  Amount local_fc0 [56];
  Amount local_f88 [56];
  AssertHelper local_f50;
  Message local_f48 [4];
  string local_f28 [32];
  AssertionResult local_f08;
  AssertHelper local_ef8;
  Message local_ef0;
  undefined1 local_ee8 [56];
  string local_eb0 [32];
  AssertionResult local_e90;
  AssertHelper local_e80;
  Message local_e78;
  undefined1 local_e70 [56];
  string local_e38 [32];
  AssertionResult local_e18;
  SigHashType local_e04 [12];
  KeyData local_df8;
  Script local_ca8;
  allocator local_c51;
  string local_c50 [32];
  Txid local_c30;
  TxIn local_c10 [144];
  Transaction local_b80 [64];
  AssertHelper local_b40;
  Message local_b38;
  string local_b30 [32];
  AssertionResult local_b10;
  AssertHelper local_b00;
  Message local_af8;
  string local_af0 [32];
  AssertionResult local_ad0;
  AssertHelper local_ac0;
  Message local_ab8 [5];
  string local_a90 [32];
  AssertionResult local_a70;
  AssertHelper local_a60;
  Message local_a58 [5];
  string local_a30 [32];
  AssertionResult local_a10;
  AssertHelper local_a00;
  Message local_9f8;
  string local_9f0 [32];
  AssertionResult local_9d0;
  AssertHelper local_9c0;
  Message local_9b8;
  string local_9b0 [32];
  AssertionResult local_990;
  AssertHelper local_980;
  Message local_978;
  string local_970 [32];
  AssertionResult local_950;
  undefined8 **local_938;
  undefined1 **local_930 [3];
  undefined1 local_918 [24];
  undefined8 **local_900;
  undefined8 local_8f8;
  undefined1 local_8f0 [24];
  KeyData local_8d8;
  undefined1 local_750 [343];
  allocator local_5f9;
  string local_5f8 [32];
  Address local_5d8 [384];
  undefined8 **local_458;
  undefined1 **local_450 [3];
  undefined1 local_438 [24];
  undefined8 **local_420;
  undefined8 local_418;
  undefined1 local_410 [24];
  Script local_3f8;
  undefined1 local_3c0 [336];
  undefined1 local_270 [343];
  allocator local_119;
  string local_118 [32];
  ByteData local_f8;
  HDWallet local_e0 [40];
  ByteData local_b8;
  HDWallet local_a0 [24];
  Psbt local_88;
  
  cfd::Psbt::Psbt(&local_88);
  cfd::core::ByteData::ByteData(&local_b8,(string *)&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(local_a0,&local_b8);
  cfd::core::ByteData::~ByteData((ByteData *)0x24d906);
  cfd::core::ByteData::ByteData(&local_f8,(string *)&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(local_e0,&local_f8);
  cfd::core::ByteData::~ByteData((ByteData *)0x24d940);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"44h/0h/0h/0/12",&local_119);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)local_270,(string *)local_a0);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)local_3c0,(string *)local_e0);
  local_458 = local_450;
  cfd::core::KeyData::GetPubkey();
  local_458 = (undefined8 **)local_438;
  cfd::core::KeyData::GetPubkey();
  local_420 = local_450;
  local_418 = 2;
  std::allocator<cfd::core::Pubkey>::allocator((allocator<cfd::core::Pubkey> *)0x24da37);
  __l._M_len = (size_type)in_stack_ffffffffffffdfb0;
  __l._M_array = &in_stack_ffffffffffffdfa8->pubkey_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffdfa0,__l,
             (allocator_type *)
             CONCAT17(in_stack_ffffffffffffdf9f,
                      CONCAT16(in_stack_ffffffffffffdf9e,
                               CONCAT15(in_stack_ffffffffffffdf9d,in_stack_ffffffffffffdf98))));
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            ((uint)&local_3f8,(vector *)0x2,SUB81(local_410,0));
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffdf80);
  std::allocator<cfd::core::Pubkey>::~allocator((allocator<cfd::core::Pubkey> *)0x24da99);
  local_1d18 = (undefined1 ***)&local_420;
  do {
    local_1d18 = local_1d18 + -3;
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x24dace);
  } while (local_1d18 != local_450);
  cfd::core::Address::Address(local_5d8,kTestnet,kVersion0,&local_3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f8,"44h/0h/0h/0/11",&local_5f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  cfd::core::HDWallet::GeneratePrivkeyData((NetType)local_750,(string *)local_a0);
  cfd::core::HDWallet::GeneratePrivkeyData((int)&local_8d8 + 0x38,(string *)local_e0);
  local_938 = local_930;
  cfd::core::KeyData::GetPubkey();
  local_938 = (undefined8 **)local_918;
  cfd::core::KeyData::GetPubkey();
  local_900 = local_930;
  local_8f8 = 2;
  std::allocator<cfd::core::Pubkey>::allocator((allocator<cfd::core::Pubkey> *)0x24dc00);
  __l_00._M_len = (size_type)in_stack_ffffffffffffdfb0;
  __l_00._M_array = &in_stack_ffffffffffffdfa8->pubkey_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffdfa0,__l_00,
             (allocator_type *)
             CONCAT17(in_stack_ffffffffffffdf9f,
                      CONCAT16(in_stack_ffffffffffffdf9e,
                               CONCAT15(in_stack_ffffffffffffdf9d,in_stack_ffffffffffffdf98))));
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            ((uint)&local_8d8,(vector *)0x2,SUB81(local_8f0,0));
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffdf80);
  std::allocator<cfd::core::Pubkey>::~allocator((allocator<cfd::core::Pubkey> *)0x24dc62);
  local_1d40 = (undefined1 ***)&local_900;
  do {
    local_1d40 = local_1d40 + -3;
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x24dc97);
  } while (local_1d40 != local_930);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_950,
             "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
             ,"multisig.GetHex().c_str()",
             "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
             ,pcVar3);
  std::__cxx11::string::~string(local_970);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_950);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x24e100);
    testing::internal::AssertHelper::AssertHelper
              (&local_980,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x19b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_980,&local_978);
    testing::internal::AssertHelper::~AssertHelper(&local_980);
    testing::Message::~Message((Message *)0x24e163);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24e1bb);
  cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_9b0,0),(HardenedType)local_270,true);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_990,
             "\"[2a704760/44\'/0\'/0\'/0/12]02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b\""
             ,"key1.ToString().c_str()",
             "[2a704760/44\'/0\'/0\'/0/12]02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b"
             ,pcVar3);
  std::__cxx11::string::~string(local_9b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_990);
  if (!bVar1) {
    testing::Message::Message(&local_9b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x24e2b3);
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x19d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9c0,&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    testing::Message::~Message((Message *)0x24e316);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24e36e);
  cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_9f0,0),(HardenedType)local_3c0,true);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_9d0,
             "\"[9d6b6d86/44\'/0\'/0\'/0/12]02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242\""
             ,"key2.ToString().c_str()",
             "[9d6b6d86/44\'/0\'/0\'/0/12]02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242"
             ,pcVar3);
  std::__cxx11::string::~string(local_9f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9d0);
  if (!bVar1) {
    testing::Message::Message(&local_9f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x24e466);
    testing::internal::AssertHelper::AssertHelper
              (&local_a00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x19e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a00,&local_9f8);
    testing::internal::AssertHelper::~AssertHelper(&local_a00);
    testing::Message::~Message((Message *)0x24e4c9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24e521);
  cfd::core::KeyData::GetPrivkey();
  cfd::core::Privkey::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_a10,
             "\"ac9aa506601b23ea7362dfcb9350ff3c2edeb67b334258d6489889e67dfa417f\"",
             "key_in1.GetPrivkey().GetHex().c_str()",
             "ac9aa506601b23ea7362dfcb9350ff3c2edeb67b334258d6489889e67dfa417f",pcVar3);
  std::__cxx11::string::~string(local_a30);
  cfd::core::Privkey::~Privkey((Privkey *)0x24e59d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a10);
  if (!bVar1) {
    testing::Message::Message(local_a58);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x24e655);
    testing::internal::AssertHelper::AssertHelper
              (&local_a60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x19f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a60,local_a58);
    testing::internal::AssertHelper::~AssertHelper(&local_a60);
    testing::Message::~Message((Message *)0x24e6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24e710);
  cfd::core::KeyData::GetPrivkey();
  cfd::core::Privkey::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_a70,
             "\"973e1d45dca188b0c0ac67bcc5de3ccdbe479d7505bdc43c57231c75f8db55e3\"",
             "key_in2.GetPrivkey().GetHex().c_str()",
             "973e1d45dca188b0c0ac67bcc5de3ccdbe479d7505bdc43c57231c75f8db55e3",pcVar3);
  std::__cxx11::string::~string(local_a90);
  cfd::core::Privkey::~Privkey((Privkey *)0x24e78c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a70);
  if (!bVar1) {
    testing::Message::Message(local_ab8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x24e844);
    testing::internal::AssertHelper::AssertHelper
              (&local_ac0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x1a0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_ac0,local_ab8);
    testing::internal::AssertHelper::~AssertHelper(&local_ac0);
    testing::Message::~Message((Message *)0x24e8a7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24e8ff);
  cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_af0,0),(HardenedType)local_750,true);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_ad0,
             "\"[2a704760/44\'/0\'/0\'/0/11]03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3\""
             ,"key_in1.ToString().c_str()",
             "[2a704760/44\'/0\'/0\'/0/11]03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3"
             ,pcVar3);
  std::__cxx11::string::~string(local_af0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ad0);
  if (!bVar1) {
    testing::Message::Message(&local_af8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x24e9f7);
    testing::internal::AssertHelper::AssertHelper
              (&local_b00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x1a1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b00,&local_af8);
    testing::internal::AssertHelper::~AssertHelper(&local_b00);
    testing::Message::~Message((Message *)0x24ea5a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24eab2);
  cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_b30,0),(int)&local_8d8 + 0x38,true);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_b10,
             "\"[9d6b6d86/44\'/0\'/0\'/0/11]03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47\""
             ,"key_in2.ToString().c_str()",
             "[9d6b6d86/44\'/0\'/0\'/0/11]03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47"
             ,pcVar3);
  std::__cxx11::string::~string(local_b30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b10);
  if (!bVar1) {
    testing::Message::Message(&local_b38);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x24ebaa);
    testing::internal::AssertHelper::AssertHelper
              (&local_b40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x1a2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b40,&local_b38);
    testing::internal::AssertHelper::~AssertHelper(&local_b40);
    testing::Message::~Message((Message *)0x24ec0d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24ec65);
  cfd::core::Transaction::Transaction(local_b80,(string *)&g_psbt_utxo_sh_wsh_multi_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c50,"544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69",&local_c51
            );
  cfd::core::Txid::Txid(&local_c30,local_c50);
  cfd::core::TxIn::TxIn(local_c10,&local_c30,0,0xffffffff);
  cfd::core::Txid::~Txid((Txid *)0x24ecf0);
  std::__cxx11::string::~string(local_c50);
  std::allocator<char>::~allocator((allocator<char> *)&local_c51);
  cfd::core::Psbt::AddTxIn((TxIn *)&local_88);
  cfd::core::Transaction::GetTxOut((uint)&local_ca8);
  cfd::core::KeyData::KeyData(&local_df8);
  cfd::core::Psbt::SetTxInUtxo((uint)&local_88,(TxOutReference *)0x0,&local_ca8,&local_8d8);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffdf70);
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x24ed8c);
  cfd::core::SigHashType::SigHashType(local_e04);
  cfd::core::Psbt::SetTxInSighashType((uint)&local_88,(SigHashType *)0x0);
  cfd::core::Psbt::GetTxInRedeemScriptDirect((uint)local_e70,SUB81(&local_88,0),false);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_e18,
             "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
             ,"psbt.GetTxInRedeemScriptDirect(0, true, true).GetHex().c_str()",
             "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
             ,pcVar3);
  std::__cxx11::string::~string(local_e38);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffdf70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e18);
  if (!bVar1) {
    testing::Message::Message(&local_e78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x24efc4);
    testing::internal::AssertHelper::AssertHelper
              (&local_e80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x1ac,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e80,&local_e78);
    testing::internal::AssertHelper::~AssertHelper(&local_e80);
    testing::Message::~Message((Message *)0x24f027);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24f07f);
  cfd::core::Psbt::GetTxInRedeemScriptDirect((uint)local_ee8,SUB81(&local_88,0),false);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_e90,
             "\"00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9\"",
             "psbt.GetTxInRedeemScriptDirect(0, true, false).GetHex().c_str()",
             "00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9",pcVar3);
  std::__cxx11::string::~string(local_eb0);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffdf70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e90);
  if (!bVar1) {
    testing::Message::Message(&local_ef0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x24f1be);
    testing::internal::AssertHelper::AssertHelper
              (&local_ef8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x1ae,pcVar3);
    testing::internal::AssertHelper::operator=(&local_ef8,&local_ef0);
    testing::internal::AssertHelper::~AssertHelper(&local_ef8);
    testing::Message::~Message((Message *)0x24f221);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24f279);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_f08,
             "\"70736274ff0100330200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff0000000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff0100330200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff0000000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00"
             ,pcVar3);
  std::__cxx11::string::~string(local_f28);
  cfd::core::ByteData::~ByteData((ByteData *)0x24f2f5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f08);
  if (!bVar1) {
    testing::Message::Message(local_f48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x24f3ad);
    testing::internal::AssertHelper::AssertHelper
              (&local_f50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x1af,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f50,local_f48);
    testing::internal::AssertHelper::~AssertHelper(&local_f50);
    testing::Message::~Message((Message *)0x24f410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24f465);
  cfd::core::Amount::Amount(local_f88,0x1dcd4b10);
  cfd::core::Address::GetLockingScript();
  cfd::core::Psbt::AddTxOut((Script *)&local_88,local_fc0);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffdf70);
  local_1290 = local_1288;
  cfd::core::KeyData::KeyData(in_stack_ffffffffffffdfb0,in_stack_ffffffffffffdfa8);
  local_1290 = (undefined8 **)local_1138;
  cfd::core::KeyData::KeyData(in_stack_ffffffffffffdfb0,in_stack_ffffffffffffdfa8);
  local_fe8 = local_1288;
  local_fe0 = 2;
  std::allocator<cfd::core::KeyData>::allocator((allocator<cfd::core::KeyData> *)0x24f74f);
  __l_01._M_len = (size_type)in_stack_ffffffffffffdfb0;
  __l_01._M_array = in_stack_ffffffffffffdfa8;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             in_stack_ffffffffffffdfa0,__l_01,
             (allocator_type *)
             CONCAT17(in_stack_ffffffffffffdf9f,
                      CONCAT16(in_stack_ffffffffffffdf9e,
                               CONCAT15(in_stack_ffffffffffffdf9d,in_stack_ffffffffffffdf98))));
  cfd::core::Psbt::SetTxOutData((uint)&local_88,(Script *)0x0,(vector *)&local_3f8);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             in_stack_ffffffffffffdf80);
  std::allocator<cfd::core::KeyData>::~allocator((allocator<cfd::core::KeyData> *)0x24f7b1);
  local_1e70 = (undefined1 ***)&local_fe8;
  do {
    local_1e70 = local_1e70 + -0x2a;
    cfd::core::KeyData::~KeyData(in_stack_ffffffffffffdf70);
  } while (local_1e70 != local_1288);
  cfd::Psbt::Psbt(&local_1340);
  cfd::core::Psbt::AddTxIn((TxIn *)&local_1340);
  cfd::core::Transaction::GetTxOut((uint)&local_1390);
  cfd::core::Psbt::SetTxInUtxo((uint)&local_1340,(TxOutReference *)0x0,&local_1390,&local_8d8);
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x24fbf8);
  cfd::Psbt::Psbt(&local_1438);
  cfd::core::Psbt::AddTxIn((TxIn *)&local_1438);
  cfd::core::Transaction::GetTxOut((uint)&local_1488);
  cfd::core::Psbt::SetTxInUtxo((uint)&local_1438,(TxOutReference *)0x0,&local_1488,&local_8d8);
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x24febb);
  cfd::core::Psbt::Join(&local_88.super_Psbt,SUB81(&local_1340,0));
  cfd::core::Psbt::Join(&local_88.super_Psbt,SUB81(&local_1438,0));
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_14c0,
             "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
             ,pcVar3);
  std::__cxx11::string::~string(local_14e0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2501d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_14c0);
  if (!bVar1) {
    testing::Message::Message(local_1500);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x250292);
    testing::internal::AssertHelper::AssertHelper
              (&local_1508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x1d3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1508,local_1500);
    testing::internal::AssertHelper::~AssertHelper(&local_1508);
    testing::Message::~Message((Message *)0x2502f5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25034d);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1518,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA="
             ,pcVar3);
  std::__cxx11::string::~string(local_1538);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1518);
  if (!bVar1) {
    testing::Message::Message(&local_1540);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x25043a);
    testing::internal::AssertHelper::AssertHelper
              (&local_1548,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x1d4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1548,&local_1540);
    testing::internal::AssertHelper::~AssertHelper(&local_1548);
    testing::Message::~Message((Message *)0x25049d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2504f2);
  cfd::Psbt::operator=(&local_1340,&local_88);
  cfd::core::KeyData::GetPrivkey();
  cfd::core::Psbt::Sign((Privkey *)&local_1340,SUB81(local_1590,0));
  cfd::core::Privkey::~Privkey((Privkey *)0x25076d);
  cfd::Psbt::operator=(&local_1438,&local_88);
  cfd::core::Psbt::GetTxInSighashType((uint)local_15c4);
  cfd::core::Psbt::GetTxInUtxo((uint)local_1618,SUB81(&local_88,0),(bool *)0x0);
  cfd::core::Psbt::GetTransaction();
  cfd::core::Psbt::GetTxInRedeemScript((uint)local_16c0,SUB81(&local_88,0),(bool *)0x0);
  cfd::core::Script::GetData();
  cfd::core::SigHashType::SigHashType(local_16cc,local_15c4);
  local_16f0 = cfd::core::AbstractTxOut::GetValue();
  uVar6 = 0;
  pcVar3 = (char *)&local_16e0;
  local_16e8 = extraout_DL;
  local_16e0 = local_16f0;
  local_16d8 = extraout_DL;
  cfd::core::Transaction::GetSignatureHash(local_1670,local_1658,0,local_1688,local_16cc);
  cfd::core::ByteData::~ByteData((ByteData *)0x250b0d);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffdf70);
  cfd::core::KeyData::GetPrivkey();
  cfd::core::Privkey::CalculateEcSignature(&local_1708,SUB81(local_1728,0));
  cfd::core::Privkey::~Privkey((Privkey *)0x250b62);
  cfd::core::CryptoUtil::ConvertSignatureToDer(&local_1740,(SigHashType *)&local_1708);
  cfd::core::ByteData::operator=
            ((ByteData *)in_stack_ffffffffffffdf70,
             (ByteData *)CONCAT44(in_stack_ffffffffffffdf6c,uVar6));
  cfd::core::ByteData::~ByteData((ByteData *)0x250bb3);
  cfd::core::Psbt::SetTxInSignature
            ((uint)&local_1438,(KeyData *)0x0,&local_8d8.extprivkey_.serialize_data_);
  cfd::core::ByteData::~ByteData((ByteData *)0x250be1);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x250bee);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffdf70);
  cfd::core::TxOut::~TxOut((TxOut *)0x250c08);
  cfd::core::Psbt::Combine(&local_88.super_Psbt);
  cfd::core::Psbt::Combine(&local_88.super_Psbt);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1778,
             "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
             ,pcVar4);
  std::__cxx11::string::~string(local_1798);
  cfd::core::ByteData::~ByteData((ByteData *)0x250fdb);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1778);
  if (!bVar1) {
    testing::Message::Message(local_17b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x25109d);
    testing::internal::AssertHelper::AssertHelper
              (&local_17c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x1f6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_17c0,local_17b8);
    testing::internal::AssertHelper::~AssertHelper(&local_17c0);
    testing::Message::~Message((Message *)0x251100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x251158);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_17d0,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA"
             ,pcVar4);
  std::__cxx11::string::~string(local_17f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_17d0);
  if (!bVar1) {
    testing::Message::Message(&local_17f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x251245);
    testing::internal::AssertHelper::AssertHelper
              (&local_1800,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x1f7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1800,&local_17f8);
    testing::internal::AssertHelper::~AssertHelper(&local_1800);
    testing::Message::~Message((Message *)0x2512a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2512fd);
  cfd::core::KeyData::GetPubkey();
  cfd::core::Psbt::GetTxInSignature((uint)local_1840,(Pubkey *)&local_88);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x251566);
  cfd::core::KeyData::GetPubkey();
  cfd::core::Psbt::GetTxInSignature((uint)local_1870,(Pubkey *)&local_88);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2515ab);
  cfd::core::Psbt::GetTxInRedeemScript((uint)local_18c0,SUB81(&local_88,0),(bool *)0x0);
  bVar2 = cfd::core::Psbt::IsFinalizedInput((uint)&local_88);
  local_18d1 = ~bVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffdf70,
             (bool *)CONCAT44(in_stack_ffffffffffffdf6c,uVar6),(type *)0x25160c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18d0);
  if (!bVar1) {
    testing::Message::Message(&local_18e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1908,(internal *)&local_18d0,(AssertionResult *)"psbt.IsFinalizedInput(0)",
               "true","false",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_18e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x201,pcVar4);
    testing::internal::AssertHelper::operator=(&local_18e8,&local_18e0);
    testing::internal::AssertHelper::~AssertHelper(&local_18e8);
    std::__cxx11::string::~string((string *)&local_1908);
    testing::Message::~Message((Message *)0x2517ab);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x251823);
  bVar2 = cfd::core::Psbt::IsFinalized();
  local_1919 = ~bVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffdf70,
             (bool *)CONCAT44(in_stack_ffffffffffffdf6c,uVar6),(type *)0x251864);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1918);
  if (!bVar1) {
    testing::Message::Message(&local_1928);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1950,(internal *)&local_1918,(AssertionResult *)"psbt.IsFinalized()","true",
               "false",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1930,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x202,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1930,&local_1928);
    testing::internal::AssertHelper::~AssertHelper(&local_1930);
    std::__cxx11::string::~string((string *)&local_1950);
    testing::Message::~Message((Message *)0x251962);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2519dd);
  local_19e0 = &local_19d8;
  cfd::core::ByteData::ByteData(local_19e0);
  local_19e0 = (ByteData *)local_19c0;
  cfd::core::ByteData::ByteData
            ((ByteData *)in_stack_ffffffffffffdf70,
             (ByteData *)CONCAT44(in_stack_ffffffffffffdf6c,uVar6));
  local_19e0 = (ByteData *)local_19a8;
  cfd::core::ByteData::ByteData
            ((ByteData *)in_stack_ffffffffffffdf70,
             (ByteData *)CONCAT44(in_stack_ffffffffffffdf6c,uVar6));
  local_19e0 = (ByteData *)local_1990;
  cfd::core::Script::GetData();
  local_1978.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_19d8;
  local_1978.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4;
  std::allocator<cfd::core::ByteData>::allocator((allocator<cfd::core::ByteData> *)0x251a82);
  __l_02._M_len = (size_type)in_stack_ffffffffffffdfb0;
  __l_02._M_array = (iterator)in_stack_ffffffffffffdfa8;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (in_stack_ffffffffffffdfa0,__l_02,
             (allocator_type *)
             CONCAT17(in_stack_ffffffffffffdf9f,
                      CONCAT16(in_stack_ffffffffffffdf9e,
                               CONCAT15(in_stack_ffffffffffffdf9d,in_stack_ffffffffffffdf98))));
  cfd::core::Psbt::SetTxInFinalScript((uint)&local_88,(vector *)0x0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (in_stack_ffffffffffffdf80);
  std::allocator<cfd::core::ByteData>::~allocator((allocator<cfd::core::ByteData> *)0x251adc);
  local_1fc8 = &local_1978;
  do {
    local_1fc8 = local_1fc8 + -1;
    cfd::core::ByteData::~ByteData((ByteData *)0x251b11);
  } while (local_1fc8 != &local_19d8);
  local_19f9 = cfd::core::Psbt::IsFinalizedInput((uint)&local_88);
  local_19f9 = local_19f9 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffdf70,
             (bool *)CONCAT44(in_stack_ffffffffffffdf6c,uVar6),(type *)0x251b6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_19f8);
  if (!bVar1) {
    testing::Message::Message(&local_1a08);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a30,(internal *)&local_19f8,(AssertionResult *)"psbt.IsFinalizedInput(0)",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x206,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a10,&local_1a08);
    testing::internal::AssertHelper::~AssertHelper(&local_1a10);
    std::__cxx11::string::~string((string *)&local_1a30);
    testing::Message::~Message((Message *)0x251d77);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x251df2);
  cfd::core::Psbt::ClearTxInSignData((uint)&local_88);
  cfd::core::Psbt::GetTxInFinalScript((uint)&local_1a48,SUB81(&local_88,0));
  cfd::core::Psbt::GetTxInFinalScript((uint)&local_1a60,SUB81(&local_88,0));
  local_1a74 = 4;
  local_1a80 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (&local_1a48);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            (in_stack_ffffffffffffdf88,(char *)in_stack_ffffffffffffdf80,
             (int *)in_stack_ffffffffffffdf78,(unsigned_long *)in_stack_ffffffffffffdf70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a70);
  if (!bVar1) {
    testing::Message::Message(&local_1a88);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x251f2a);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x20b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a90,&local_1a88);
    testing::internal::AssertHelper::~AssertHelper(&local_1a90);
    testing::Message::~Message((Message *)0x251f8d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x251fe5);
  sVar5 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size(&local_1a48);
  if (sVar5 == 4) {
    cfd::core::Script::GetHex_abi_cxx11_();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              (&local_1a48,3);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffdf88,(char *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf78
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffdf70);
    std::__cxx11::string::~string(local_1ae0);
    std::__cxx11::string::~string(local_1ac0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1aa0);
    if (!bVar1) {
      testing::Message::Message(&local_1ae8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x252137);
      testing::internal::AssertHelper::AssertHelper
                (&local_1af0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x20d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1af0,&local_1ae8);
      testing::internal::AssertHelper::~AssertHelper(&local_1af0);
      testing::Message::~Message((Message *)0x252194);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2521e9);
  }
  local_1b04 = 1;
  local_1b10 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (&local_1a60);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            (in_stack_ffffffffffffdf88,(char *)in_stack_ffffffffffffdf80,
             (int *)in_stack_ffffffffffffdf78,(unsigned_long *)in_stack_ffffffffffffdf70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b00);
  if (!bVar1) {
    testing::Message::Message(&local_1b18);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x2522a1);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x20f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b20,&local_1b18);
    testing::internal::AssertHelper::~AssertHelper(&local_1b20);
    testing::Message::~Message((Message *)0x2522fe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x252356);
  sVar5 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size(&local_1a60);
  if (sVar5 == 1) {
    cfd::core::ScriptUtil::CreateP2wshLockingScript(&local_1b58);
    cfd::core::Script::GetData();
    cfd::core::ByteData::Serialize();
    cfd::core::ByteData::GetHex_abi_cxx11_();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              (&local_1a60,0);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffdf88,(char *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf78
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffdf70);
    std::__cxx11::string::~string(local_1bd8);
    std::__cxx11::string::~string(local_1b88);
    cfd::core::ByteData::~ByteData((ByteData *)0x252447);
    cfd::core::ByteData::~ByteData((ByteData *)0x252454);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b68);
    if (!bVar1) {
      testing::Message::Message(&local_1be0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x252568);
      testing::internal::AssertHelper::AssertHelper
                (&local_1be8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x212,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1be8,&local_1be0);
      testing::internal::AssertHelper::~AssertHelper(&local_1be8);
      testing::Message::~Message((Message *)0x2525c5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x25261a);
    cfd::core::Script::~Script((Script *)in_stack_ffffffffffffdf70);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (in_stack_ffffffffffffdf80);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (in_stack_ffffffffffffdf80);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffdf70);
  cfd::core::ByteData::~ByteData((ByteData *)0x252679);
  cfd::core::ByteData::~ByteData((ByteData *)0x252686);
  local_1c21 = cfd::core::Psbt::IsFinalized();
  local_1c21 = local_1c21 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffdf70,
             (bool *)CONCAT44(in_stack_ffffffffffffdf6c,uVar6),(type *)0x252902);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c20);
  if (!bVar1) {
    testing::Message::Message(&local_1c30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1c58,(internal *)local_1c20,(AssertionResult *)"psbt.IsFinalized()","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x21a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c38,&local_1c30);
    testing::internal::AssertHelper::~AssertHelper(&local_1c38);
    std::__cxx11::string::~string((string *)&local_1c58);
    testing::Message::~Message((Message *)0x252a01);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x252a7c);
  cfd::core::Psbt::ExtractTransaction();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1ca8,
             "\"02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000\""
             ,"tx.GetHex().c_str()",
             "02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000"
             ,pcVar3);
  std::__cxx11::string::~string(local_1cc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1ca8);
  if (!bVar1) {
    testing::Message::Message(&local_1cd0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x252b93);
    testing::internal::AssertHelper::AssertHelper
              (&local_1cd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x21c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1cd8,&local_1cd0);
    testing::internal::AssertHelper::~AssertHelper(&local_1cd8);
    testing::Message::~Message((Message *)0x252bf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x252c45);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffdf70);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffdf70);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffdf70);
  cfd::core::TxIn::~TxIn((TxIn *)0x252e95);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffdf70);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffdf70);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffdf70);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffdf70);
  std::__cxx11::string::~string(local_5f8);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffdf70);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffdf70);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffdf70);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffdf70);
  std::__cxx11::string::~string(local_118);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x252f24);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x252f31);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffdf70);
  return;
}

Assistant:

TEST(Psbt, UsecaseMultisig2) {
  Psbt psbt;
  
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/12";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path1);
  auto out_multisig = ScriptUtil::CreateMultisigRedeemScript(
    2, std::vector<Pubkey>{key1.GetPubkey(), key2.GetPubkey()});
  auto addr = Address(NetType::kTestnet, WitnessVersion::kVersion0, out_multisig);

  std::string in_path = "44h/0h/0h/0/11";
  auto key_in1 = wallet1.GeneratePrivkeyData(NetType::kTestnet, in_path);
  auto key_in2 = wallet2.GeneratePrivkeyData(NetType::kTestnet, in_path);
  auto multisig = ScriptUtil::CreateMultisigRedeemScript(
    2, std::vector<Pubkey>{key_in1.GetPubkey(), key_in2.GetPubkey()});
  EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae", multisig.GetHex().c_str());

  EXPECT_STREQ("[2a704760/44'/0'/0'/0/12]02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b", key1.ToString().c_str());
  EXPECT_STREQ("[9d6b6d86/44'/0'/0'/0/12]02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242", key2.ToString().c_str());
  EXPECT_STREQ("ac9aa506601b23ea7362dfcb9350ff3c2edeb67b334258d6489889e67dfa417f", key_in1.GetPrivkey().GetHex().c_str());
  EXPECT_STREQ("973e1d45dca188b0c0ac67bcc5de3ccdbe479d7505bdc43c57231c75f8db55e3", key_in2.GetPrivkey().GetHex().c_str());
  EXPECT_STREQ("[2a704760/44'/0'/0'/0/11]03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3", key_in1.ToString().c_str());
  EXPECT_STREQ("[9d6b6d86/44'/0'/0'/0/11]03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47", key_in2.ToString().c_str());

  Transaction utxo_tx(g_psbt_utxo_sh_wsh_multi);
  TxIn txin(Txid("544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69"), 0, 0xffffffff);

  try {
    psbt.AddTxIn(txin);
    psbt.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, KeyData());
    psbt.SetTxInSighashType(0, SigHashType());
    EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae",
        psbt.GetTxInRedeemScriptDirect(0, true, true).GetHex().c_str());
    EXPECT_STREQ("00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9",
        psbt.GetTxInRedeemScriptDirect(0, true, false).GetHex().c_str());
    EXPECT_STREQ("70736274ff0100330200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff0000000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00", psbt.GetData().GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Amount amount(499993360);
  try {
    psbt.AddTxOut(addr.GetLockingScript(), amount);
    psbt.SetTxOutData(0, out_multisig, std::vector<KeyData>{key1, key2});
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Psbt psbt1;
  try {
    psbt1.AddTxIn(txin);
    psbt1.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, key_in1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Psbt psbt2;
  try {
    psbt2.AddTxIn(txin);
    psbt2.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, key_in2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Join(psbt1);
    psbt.Join(psbt2);
    EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt1 = psbt;
    psbt1.Sign(key_in1.GetPrivkey());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt2 = psbt;
    // psbt2.Sign(key_in2.GetPrivkey());
    // Same processing.
    auto sighash_type = psbt.GetTxInSighashType(0);
    auto utxo_txout = psbt.GetTxInUtxo(0);
    auto tx = psbt.GetTransaction();
    auto sighash = tx.GetSignatureHash(0, psbt.GetTxInRedeemScript(0).GetData(),
        sighash_type, utxo_txout.GetValue(), WitnessVersion::kVersion0);
    auto sig = key_in2.GetPrivkey().CalculateEcSignature(sighash);
    sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
    psbt2.SetTxInSignature(0, key_in2, sig);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Combine(psbt1);
    psbt.Combine(psbt2);
    EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    auto sig1 = psbt.GetTxInSignature(0, key_in1.GetPubkey());
    auto sig2 = psbt.GetTxInSignature(0, key_in2.GetPubkey());
    auto script = psbt.GetTxInRedeemScript(0);
    EXPECT_FALSE(psbt.IsFinalizedInput(0));
    EXPECT_FALSE(psbt.IsFinalized());
    psbt.SetTxInFinalScript(
        0, std::vector<ByteData>{ByteData(), sig1, sig2, script.GetData()});
    // psbt.Finalize();
    EXPECT_TRUE(psbt.IsFinalizedInput(0));
    psbt.ClearTxInSignData(0);

    auto wit_script = psbt.GetTxInFinalScript(0, true);
    auto wsh_script = psbt.GetTxInFinalScript(0, false);
    EXPECT_EQ(4, wit_script.size());
    if (4 == wit_script.size()) {
      EXPECT_EQ(script.GetHex(), wit_script[3].GetHex());
    }
    EXPECT_EQ(1, wsh_script.size());
    if (1 == wsh_script.size()) {
      auto exp_script = ScriptUtil::CreateP2wshLockingScript(script);
      EXPECT_EQ(exp_script.GetData().Serialize().GetHex(), wsh_script[0].GetHex());
    }
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    EXPECT_TRUE(psbt.IsFinalized());
    auto tx = psbt.ExtractTransaction();
    EXPECT_STREQ("02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000", tx.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }
}